

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<4,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  RTCIntersectArguments *pRVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined4 uVar25;
  ulong *puVar26;
  ulong uVar27;
  long lVar28;
  undefined4 uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  size_t sVar37;
  ulong uVar38;
  NodeRef *pNVar39;
  bool bVar40;
  vint4 ai_1;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi_1;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  vint4 bi;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  vint4 ai;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar101;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  UVIdentity<4> mapUV;
  Scene *scene;
  int local_acc;
  undefined1 local_ac8 [16];
  undefined8 local_ab8;
  float fStack_ab0;
  float fStack_aac;
  NodeRef *local_aa0;
  RayQueryContext *local_a98;
  ulong local_a90;
  ulong local_a88;
  ulong local_a80;
  ulong local_a78;
  ulong local_a70;
  ulong local_a68;
  ulong local_a60;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  UVIdentity<4> *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  auVar24 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar2 = ray->tfar;
    if (0.0 <= fVar2) {
      local_aa0 = stack + 1;
      auVar71 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar3 = (ray->dir).field_0;
      auVar67._8_4_ = 0x7fffffff;
      auVar67._0_8_ = 0x7fffffff7fffffff;
      auVar67._12_4_ = 0x7fffffff;
      auVar47 = vandps_avx((undefined1  [16])aVar3,auVar67);
      auVar78._8_4_ = 0x219392ef;
      auVar78._0_8_ = 0x219392ef219392ef;
      auVar78._12_4_ = 0x219392ef;
      auVar47 = vcmpps_avx(auVar47,auVar78,1);
      auVar47 = vblendvps_avx((undefined1  [16])aVar3,auVar78,auVar47);
      auVar53 = vrcpps_avx(auVar47);
      auVar79._8_4_ = 0x3f800000;
      auVar79._0_8_ = &DAT_3f8000003f800000;
      auVar79._12_4_ = 0x3f800000;
      auVar47 = vfnmadd213ps_fma(auVar47,auVar53,auVar79);
      auVar79 = vfmadd132ps_fma(auVar47,auVar53,auVar53);
      fVar60 = auVar79._0_4_;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar47 = vmovshdup_avx(auVar79);
      auVar78 = vshufps_avx(auVar79,auVar79,0x55);
      auVar53 = vshufpd_avx(auVar79,auVar79,1);
      auVar89._0_4_ = fVar60 * (ray->org).field_0.m128[0];
      auVar89._4_4_ = auVar79._4_4_ * (ray->org).field_0.m128[1];
      auVar89._8_4_ = auVar79._8_4_ * (ray->org).field_0.m128[2];
      auVar89._12_4_ = auVar79._12_4_ * (ray->org).field_0.m128[3];
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      auVar41 = vshufps_avx(auVar89,auVar89,0x55);
      auVar96 = vshufps_avx(auVar89,auVar89,0xaa);
      uVar34 = (ulong)(fVar60 < 0.0) << 2;
      uVar31 = uVar34 ^ 4;
      uVar30 = (ulong)((uint)(auVar47._0_4_ < 0.0) * 4 + 8);
      uVar33 = uVar30 ^ 4;
      uVar32 = (ulong)((uint)(auVar53._0_4_ < 0.0) * 4 + 0x10);
      uVar38 = uVar32 ^ 4;
      auVar61._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
      auVar61._8_4_ = auVar41._8_4_ ^ 0x80000000;
      auVar61._12_4_ = auVar41._12_4_ ^ 0x80000000;
      auVar53._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
      auVar53._8_4_ = auVar96._8_4_ ^ 0x80000000;
      auVar53._12_4_ = auVar96._12_4_ ^ 0x80000000;
      auVar47._0_4_ = auVar71._0_4_;
      auVar47._4_4_ = auVar47._0_4_;
      auVar47._8_4_ = auVar47._0_4_;
      auVar47._12_4_ = auVar47._0_4_;
      local_a98 = context;
      local_a90 = uVar38;
      local_a88 = uVar32;
      local_a80 = uVar33;
      local_a78 = uVar30;
      local_a70 = uVar31;
      do {
        pNVar39 = stack;
        if (local_aa0 == pNVar39) {
          return;
        }
        sVar37 = local_aa0[-1].ptr;
        local_aa0 = local_aa0 + -1;
        do {
          if ((sVar37 & 8) == 0) {
            puVar26 = (ulong *)((sVar37 & 0xfffffffffffffff0) + 0x20);
            if ((sVar37 & 0xfffffffffffffff0) == 0) {
              puVar26 = (ulong *)0x0;
            }
            uVar25 = (undefined4)puVar26[3];
            auVar54._4_4_ = uVar25;
            auVar54._0_4_ = uVar25;
            auVar54._8_4_ = uVar25;
            auVar54._12_4_ = uVar25;
            uVar25 = *(undefined4 *)((long)puVar26 + 0x24);
            auVar62._4_4_ = uVar25;
            auVar62._0_4_ = uVar25;
            auVar62._8_4_ = uVar25;
            auVar62._12_4_ = uVar25;
            auVar71._8_8_ = 0;
            auVar71._0_8_ = *(ulong *)((long)puVar26 + uVar34);
            auVar71 = vpmovzxbd_avx(auVar71);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar96 = vfmadd213ps_fma(auVar71,auVar62,auVar54);
            auVar41._8_8_ = 0;
            auVar41._0_8_ = *(ulong *)((long)puVar26 + uVar31);
            auVar71 = vpmovzxbd_avx(auVar41);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar97 = vfmadd213ps_fma(auVar71,auVar62,auVar54);
            uVar25 = *(undefined4 *)((long)puVar26 + 0x1c);
            auVar68._4_4_ = uVar25;
            auVar68._0_4_ = uVar25;
            auVar68._8_4_ = uVar25;
            auVar68._12_4_ = uVar25;
            uVar25 = (undefined4)puVar26[5];
            auVar80._4_4_ = uVar25;
            auVar80._0_4_ = uVar25;
            auVar80._8_4_ = uVar25;
            auVar80._12_4_ = uVar25;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = *(ulong *)((long)puVar26 + uVar30);
            auVar71 = vpmovzxbd_avx(auVar55);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar54 = vfmadd213ps_fma(auVar71,auVar80,auVar68);
            auVar56._8_8_ = 0;
            auVar56._0_8_ = *(ulong *)((long)puVar26 + uVar33);
            auVar71 = vpmovzxbd_avx(auVar56);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar55 = vfmadd213ps_fma(auVar71,auVar80,auVar68);
            uVar25 = (undefined4)puVar26[4];
            auVar69._4_4_ = uVar25;
            auVar69._0_4_ = uVar25;
            auVar69._8_4_ = uVar25;
            auVar69._12_4_ = uVar25;
            uVar25 = *(undefined4 *)((long)puVar26 + 0x2c);
            auVar81._4_4_ = uVar25;
            auVar81._0_4_ = uVar25;
            auVar81._8_4_ = uVar25;
            auVar81._12_4_ = uVar25;
            auVar90._8_8_ = 0;
            auVar90._0_8_ = *(ulong *)((long)puVar26 + uVar32);
            auVar71 = vpmovzxbd_avx(auVar90);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar56 = vfmadd213ps_fma(auVar71,auVar81,auVar69);
            auVar98._8_8_ = 0;
            auVar98._0_8_ = *(ulong *)((long)puVar26 + uVar38);
            auVar71 = vpmovzxbd_avx(auVar98);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar62 = vfmadd213ps_fma(auVar71,auVar81,auVar69);
            auVar70._8_8_ = 0;
            auVar70._0_8_ = *puVar26;
            auVar82._8_8_ = 0;
            auVar82._0_8_ = *(ulong *)((long)puVar26 + 4);
            auVar41 = vpminub_avx(auVar70,auVar82);
            auVar71 = vpcmpeqb_avx(auVar70,auVar41);
            auVar41 = vpcmpeqd_avx(auVar41,auVar41);
            auVar71 = vpmovzxbd_avx(auVar71 ^ auVar41);
            auVar71 = vpslld_avx(auVar71 ^ auVar41,0x1f);
            uVar25 = vmovmskps_avx(auVar71);
            auVar21._4_4_ = fVar60;
            auVar21._0_4_ = fVar60;
            auVar21._8_4_ = fVar60;
            auVar21._12_4_ = fVar60;
            auVar20._4_4_ = -auVar89._0_4_;
            auVar20._0_4_ = -auVar89._0_4_;
            auVar20._8_4_ = -auVar89._0_4_;
            auVar20._12_4_ = -auVar89._0_4_;
            auVar71 = vfmadd213ps_fma(auVar96,auVar21,auVar20);
            auVar41 = vfmadd213ps_fma(auVar54,auVar78,auVar61);
            auVar71 = vpmaxsd_avx(auVar71,auVar41);
            auVar41 = vfmadd213ps_fma(auVar56,auVar79,auVar53);
            auVar41 = vpmaxsd_avx(auVar41,auVar47);
            auVar71 = vpmaxsd_avx(auVar71,auVar41);
            auVar41 = vfmadd213ps_fma(auVar97,auVar21,auVar20);
            auVar96 = vfmadd213ps_fma(auVar55,auVar78,auVar61);
            auVar41 = vpminsd_avx(auVar41,auVar96);
            auVar96 = vfmadd213ps_fma(auVar62,auVar79,auVar53);
            auVar97._4_4_ = fVar2;
            auVar97._0_4_ = fVar2;
            auVar97._8_4_ = fVar2;
            auVar97._12_4_ = fVar2;
            auVar96 = vpminsd_avx(auVar96,auVar97);
            auVar41 = vpminsd_avx(auVar41,auVar96);
            auVar71 = vpcmpgtd_avx(auVar71,auVar41);
            uVar29 = vmovmskps_avx(auVar71);
            unaff_RBP = (ulong)(byte)(~(byte)uVar29 & (byte)uVar25);
          }
          if ((sVar37 & 8) == 0) {
            if (unaff_RBP == 0) {
              iVar35 = 4;
            }
            else {
              uVar36 = sVar37 & 0xfffffffffffffff0;
              lVar28 = 0;
              for (uVar27 = unaff_RBP; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000)
              {
                lVar28 = lVar28 + 1;
              }
              iVar35 = 0;
              for (uVar27 = unaff_RBP - 1 & unaff_RBP; sVar37 = *(size_t *)(uVar36 + lVar28 * 8),
                  uVar27 != 0; uVar27 = uVar27 - 1 & uVar27) {
                local_aa0->ptr = sVar37;
                local_aa0 = local_aa0 + 1;
                lVar28 = 0;
                for (uVar22 = uVar27; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  lVar28 = lVar28 + 1;
                }
              }
            }
          }
          else {
            iVar35 = 6;
          }
        } while (iVar35 == 0);
        if (iVar35 == 6) {
          iVar35 = 0;
          local_a68 = (ulong)((uint)sVar37 & 0xf) - 8;
          bVar40 = local_a68 != 0;
          if (bVar40) {
            uVar27 = sVar37 & 0xfffffffffffffff0;
            pSVar4 = local_a98->scene;
            local_a60 = 0;
            do {
              lVar28 = local_a60 * 0x50;
              ppfVar5 = (pSVar4->vertices).items;
              pfVar6 = ppfVar5[*(uint *)(uVar27 + 0x30 + lVar28)];
              pfVar7 = ppfVar5[*(uint *)(uVar27 + 0x34 + lVar28)];
              pfVar8 = ppfVar5[*(uint *)(uVar27 + 0x38 + lVar28)];
              pfVar9 = ppfVar5[*(uint *)(uVar27 + 0x3c + lVar28)];
              auVar96 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar27 + 8 + lVar28)));
              auVar71 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar27 + 8 + lVar28)));
              auVar97 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar27 + 4 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar27 + 0xc + lVar28)));
              auVar41 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar27 + 4 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar27 + 0xc + lVar28)));
              auVar55 = vunpcklps_avx(auVar71,auVar41);
              auVar54 = vunpcklps_avx(auVar96,auVar97);
              auVar71 = vunpckhps_avx(auVar96,auVar97);
              auVar97 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar27 + 0x10 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar27 + 0x18 + lVar28)));
              auVar41 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar27 + 0x10 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar27 + 0x18 + lVar28)));
              auVar56 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar27 + 0x14 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar27 + 0x1c + lVar28)));
              auVar96 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar27 + 0x14 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar27 + 0x1c + lVar28)));
              auVar20 = vunpcklps_avx(auVar41,auVar96);
              auVar21 = vunpcklps_avx(auVar97,auVar56);
              auVar96 = vunpckhps_avx(auVar97,auVar56);
              auVar56 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar27 + 0x20 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar27 + 0x28 + lVar28)));
              auVar41 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar27 + 0x20 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar27 + 0x28 + lVar28)));
              auVar62 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar27 + 0x24 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar27 + 0x2c + lVar28)));
              auVar97 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar27 + 0x24 + lVar28)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar27 + 0x2c + lVar28)));
              auVar68 = vunpcklps_avx(auVar41,auVar97);
              auVar69 = vunpcklps_avx(auVar56,auVar62);
              auVar62 = vunpckhps_avx(auVar56,auVar62);
              puVar1 = (undefined8 *)(uVar27 + 0x30 + lVar28);
              local_898 = *puVar1;
              uStack_890 = puVar1[1];
              puVar1 = (undefined8 *)(uVar27 + 0x40 + lVar28);
              local_8a8 = *puVar1;
              uStack_8a0 = puVar1[1];
              uVar25 = *(undefined4 *)&(ray->org).field_0;
              auVar107._4_4_ = uVar25;
              auVar107._0_4_ = uVar25;
              auVar107._8_4_ = uVar25;
              auVar107._12_4_ = uVar25;
              uVar25 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar110._4_4_ = uVar25;
              auVar110._0_4_ = uVar25;
              auVar110._8_4_ = uVar25;
              auVar110._12_4_ = uVar25;
              uVar25 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar115._4_4_ = uVar25;
              auVar115._0_4_ = uVar25;
              auVar115._8_4_ = uVar25;
              auVar115._12_4_ = uVar25;
              auVar97 = vsubps_avx(auVar54,auVar107);
              auVar54 = vsubps_avx(auVar71,auVar110);
              auVar71 = vsubps_avx(auVar55,auVar115);
              auVar41 = vsubps_avx(auVar21,auVar107);
              auVar96 = vsubps_avx(auVar96,auVar110);
              auVar55 = vsubps_avx(auVar20,auVar115);
              auVar56 = vsubps_avx(auVar69,auVar107);
              auVar62 = vsubps_avx(auVar62,auVar110);
              auVar20 = vsubps_avx(auVar68,auVar115);
              auVar21 = vsubps_avx(auVar56,auVar97);
              auVar68 = vsubps_avx(auVar62,auVar54);
              auVar69 = vsubps_avx(auVar20,auVar71);
              auVar42._0_4_ = auVar56._0_4_ + auVar97._0_4_;
              auVar42._4_4_ = auVar56._4_4_ + auVar97._4_4_;
              auVar42._8_4_ = auVar56._8_4_ + auVar97._8_4_;
              auVar42._12_4_ = auVar56._12_4_ + auVar97._12_4_;
              auVar63._0_4_ = auVar62._0_4_ + auVar54._0_4_;
              auVar63._4_4_ = auVar62._4_4_ + auVar54._4_4_;
              auVar63._8_4_ = auVar62._8_4_ + auVar54._8_4_;
              auVar63._12_4_ = auVar62._12_4_ + auVar54._12_4_;
              fVar12 = auVar71._0_4_;
              auVar72._0_4_ = auVar20._0_4_ + fVar12;
              fVar13 = auVar71._4_4_;
              auVar72._4_4_ = auVar20._4_4_ + fVar13;
              fVar14 = auVar71._8_4_;
              auVar72._8_4_ = auVar20._8_4_ + fVar14;
              fVar15 = auVar71._12_4_;
              auVar72._12_4_ = auVar20._12_4_ + fVar15;
              auVar111._0_4_ = auVar69._0_4_ * auVar63._0_4_;
              auVar111._4_4_ = auVar69._4_4_ * auVar63._4_4_;
              auVar111._8_4_ = auVar69._8_4_ * auVar63._8_4_;
              auVar111._12_4_ = auVar69._12_4_ * auVar63._12_4_;
              auVar80 = vfmsub231ps_fma(auVar111,auVar68,auVar72);
              auVar73._0_4_ = auVar72._0_4_ * auVar21._0_4_;
              auVar73._4_4_ = auVar72._4_4_ * auVar21._4_4_;
              auVar73._8_4_ = auVar72._8_4_ * auVar21._8_4_;
              auVar73._12_4_ = auVar72._12_4_ * auVar21._12_4_;
              auVar70 = vfmsub231ps_fma(auVar73,auVar69,auVar42);
              auVar43._0_4_ = auVar68._0_4_ * auVar42._0_4_;
              auVar43._4_4_ = auVar68._4_4_ * auVar42._4_4_;
              auVar43._8_4_ = auVar68._8_4_ * auVar42._8_4_;
              auVar43._12_4_ = auVar68._12_4_ * auVar42._12_4_;
              auVar81 = vfmsub231ps_fma(auVar43,auVar21,auVar63);
              local_ab8._4_4_ = (ray->dir).field_0.m128[2];
              auVar116._0_4_ = local_ab8._4_4_ * auVar81._0_4_;
              auVar116._4_4_ = local_ab8._4_4_ * auVar81._4_4_;
              auVar116._8_4_ = local_ab8._4_4_ * auVar81._8_4_;
              auVar116._12_4_ = local_ab8._4_4_ * auVar81._12_4_;
              uVar25 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              auVar44._4_4_ = uVar25;
              auVar44._0_4_ = uVar25;
              auVar44._8_4_ = uVar25;
              auVar44._12_4_ = uVar25;
              auVar70 = vfmadd231ps_fma(auVar116,auVar44,auVar70);
              uVar25 = *(undefined4 *)&(ray->dir).field_0;
              auVar108._4_4_ = uVar25;
              auVar108._0_4_ = uVar25;
              auVar108._8_4_ = uVar25;
              auVar108._12_4_ = uVar25;
              local_ac8 = vfmadd231ps_fma(auVar70,auVar108,auVar80);
              auVar70 = vsubps_avx(auVar54,auVar96);
              auVar80 = vsubps_avx(auVar71,auVar55);
              auVar64._0_4_ = auVar54._0_4_ + auVar96._0_4_;
              auVar64._4_4_ = auVar54._4_4_ + auVar96._4_4_;
              auVar64._8_4_ = auVar54._8_4_ + auVar96._8_4_;
              auVar64._12_4_ = auVar54._12_4_ + auVar96._12_4_;
              auVar74._0_4_ = auVar55._0_4_ + fVar12;
              auVar74._4_4_ = auVar55._4_4_ + fVar13;
              auVar74._8_4_ = auVar55._8_4_ + fVar14;
              auVar74._12_4_ = auVar55._12_4_ + fVar15;
              fVar109 = auVar80._0_4_;
              auVar91._0_4_ = fVar109 * auVar64._0_4_;
              fVar112 = auVar80._4_4_;
              auVar91._4_4_ = fVar112 * auVar64._4_4_;
              fVar113 = auVar80._8_4_;
              auVar91._8_4_ = fVar113 * auVar64._8_4_;
              fVar114 = auVar80._12_4_;
              auVar91._12_4_ = fVar114 * auVar64._12_4_;
              auVar82 = vfmsub231ps_fma(auVar91,auVar70,auVar74);
              auVar81 = vsubps_avx(auVar97,auVar41);
              fVar16 = auVar81._0_4_;
              auVar99._0_4_ = auVar74._0_4_ * fVar16;
              fVar17 = auVar81._4_4_;
              auVar99._4_4_ = auVar74._4_4_ * fVar17;
              fVar18 = auVar81._8_4_;
              auVar99._8_4_ = auVar74._8_4_ * fVar18;
              fVar19 = auVar81._12_4_;
              auVar99._12_4_ = auVar74._12_4_ * fVar19;
              auVar75._0_4_ = auVar41._0_4_ + auVar97._0_4_;
              auVar75._4_4_ = auVar41._4_4_ + auVar97._4_4_;
              auVar75._8_4_ = auVar41._8_4_ + auVar97._8_4_;
              auVar75._12_4_ = auVar41._12_4_ + auVar97._12_4_;
              auVar71 = vfmsub231ps_fma(auVar99,auVar80,auVar75);
              fVar101 = auVar70._0_4_;
              auVar76._0_4_ = fVar101 * auVar75._0_4_;
              fVar104 = auVar70._4_4_;
              auVar76._4_4_ = fVar104 * auVar75._4_4_;
              fVar105 = auVar70._8_4_;
              auVar76._8_4_ = fVar105 * auVar75._8_4_;
              fVar106 = auVar70._12_4_;
              auVar76._12_4_ = fVar106 * auVar75._12_4_;
              auVar90 = vfmsub231ps_fma(auVar76,auVar81,auVar64);
              auVar77._0_4_ = local_ab8._4_4_ * auVar90._0_4_;
              auVar77._4_4_ = local_ab8._4_4_ * auVar90._4_4_;
              auVar77._8_4_ = local_ab8._4_4_ * auVar90._8_4_;
              auVar77._12_4_ = local_ab8._4_4_ * auVar90._12_4_;
              auVar71 = vfmadd231ps_fma(auVar77,auVar44,auVar71);
              local_878 = vfmadd231ps_fma(auVar71,auVar108,auVar82);
              auVar82 = vsubps_avx(auVar41,auVar56);
              auVar57._0_4_ = auVar41._0_4_ + auVar56._0_4_;
              auVar57._4_4_ = auVar41._4_4_ + auVar56._4_4_;
              auVar57._8_4_ = auVar41._8_4_ + auVar56._8_4_;
              auVar57._12_4_ = auVar41._12_4_ + auVar56._12_4_;
              auVar56 = vsubps_avx(auVar96,auVar62);
              auVar48._0_4_ = auVar96._0_4_ + auVar62._0_4_;
              auVar48._4_4_ = auVar96._4_4_ + auVar62._4_4_;
              auVar48._8_4_ = auVar96._8_4_ + auVar62._8_4_;
              auVar48._12_4_ = auVar96._12_4_ + auVar62._12_4_;
              auVar62 = vsubps_avx(auVar55,auVar20);
              auVar83._0_4_ = auVar55._0_4_ + auVar20._0_4_;
              auVar83._4_4_ = auVar55._4_4_ + auVar20._4_4_;
              auVar83._8_4_ = auVar55._8_4_ + auVar20._8_4_;
              auVar83._12_4_ = auVar55._12_4_ + auVar20._12_4_;
              auVar92._0_4_ = auVar62._0_4_ * auVar48._0_4_;
              auVar92._4_4_ = auVar62._4_4_ * auVar48._4_4_;
              auVar92._8_4_ = auVar62._8_4_ * auVar48._8_4_;
              auVar92._12_4_ = auVar62._12_4_ * auVar48._12_4_;
              auVar41 = vfmsub231ps_fma(auVar92,auVar56,auVar83);
              auVar84._0_4_ = auVar83._0_4_ * auVar82._0_4_;
              auVar84._4_4_ = auVar83._4_4_ * auVar82._4_4_;
              auVar84._8_4_ = auVar83._8_4_ * auVar82._8_4_;
              auVar84._12_4_ = auVar83._12_4_ * auVar82._12_4_;
              auVar71 = vfmsub231ps_fma(auVar84,auVar62,auVar57);
              auVar96._0_4_ = auVar56._0_4_ * auVar57._0_4_;
              auVar96._4_4_ = auVar56._4_4_ * auVar57._4_4_;
              auVar96._8_4_ = auVar56._8_4_ * auVar57._8_4_;
              auVar96._12_4_ = auVar56._12_4_ * auVar57._12_4_;
              auVar96 = vfmsub231ps_fma(auVar96,auVar82,auVar48);
              local_ab8._0_4_ = local_ab8._4_4_;
              fStack_ab0 = local_ab8._4_4_;
              fStack_aac = local_ab8._4_4_;
              auVar49._0_4_ = local_ab8._4_4_ * auVar96._0_4_;
              auVar49._4_4_ = local_ab8._4_4_ * auVar96._4_4_;
              auVar49._8_4_ = local_ab8._4_4_ * auVar96._8_4_;
              auVar49._12_4_ = local_ab8._4_4_ * auVar96._12_4_;
              auVar71 = vfmadd231ps_fma(auVar49,auVar44,auVar71);
              auVar55 = vfmadd231ps_fma(auVar71,auVar108,auVar41);
              local_888 = local_ac8._0_4_;
              fStack_884 = local_ac8._4_4_;
              fStack_880 = local_ac8._8_4_;
              fStack_87c = local_ac8._12_4_;
              local_868._0_4_ = auVar55._0_4_ + local_888 + local_878._0_4_;
              local_868._4_4_ = auVar55._4_4_ + fStack_884 + local_878._4_4_;
              local_868._8_4_ = auVar55._8_4_ + fStack_880 + local_878._8_4_;
              local_868._12_4_ = auVar55._12_4_ + fStack_87c + local_878._12_4_;
              auVar71 = vminps_avx(local_ac8,local_878);
              auVar41 = vminps_avx(auVar71,auVar55);
              auVar71 = vandps_avx(local_868,auVar67);
              auVar85._0_4_ = auVar71._0_4_ * 1.1920929e-07;
              auVar85._4_4_ = auVar71._4_4_ * 1.1920929e-07;
              auVar85._8_4_ = auVar71._8_4_ * 1.1920929e-07;
              auVar85._12_4_ = auVar71._12_4_ * 1.1920929e-07;
              uVar31 = CONCAT44(auVar85._4_4_,auVar85._0_4_);
              auVar93._0_8_ = uVar31 ^ 0x8000000080000000;
              auVar93._8_4_ = -auVar85._8_4_;
              auVar93._12_4_ = -auVar85._12_4_;
              auVar41 = vcmpps_avx(auVar41,auVar93,5);
              auVar96 = vmaxps_avx(local_ac8,local_878);
              auVar96 = vmaxps_avx(auVar96,auVar55);
              auVar96 = vcmpps_avx(auVar96,auVar85,2);
              auVar41 = vorps_avx(auVar41,auVar96);
              mapUV = (UVIdentity<4>)0x0;
              local_858 = &mapUV;
              auVar96 = auVar24 & auVar41;
              if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar96[0xf] < '\0') {
                auVar50._0_4_ = auVar69._0_4_ * fVar101;
                auVar50._4_4_ = auVar69._4_4_ * fVar104;
                auVar50._8_4_ = auVar69._8_4_ * fVar105;
                auVar50._12_4_ = auVar69._12_4_ * fVar106;
                auVar58._0_4_ = auVar68._0_4_ * fVar16;
                auVar58._4_4_ = auVar68._4_4_ * fVar17;
                auVar58._8_4_ = auVar68._8_4_ * fVar18;
                auVar58._12_4_ = auVar68._12_4_ * fVar19;
                auVar20 = vfmsub213ps_fma(auVar68,auVar80,auVar50);
                auVar86._0_4_ = fVar109 * auVar56._0_4_;
                auVar86._4_4_ = fVar112 * auVar56._4_4_;
                auVar86._8_4_ = fVar113 * auVar56._8_4_;
                auVar86._12_4_ = fVar114 * auVar56._12_4_;
                auVar94._0_4_ = fVar16 * auVar62._0_4_;
                auVar94._4_4_ = fVar17 * auVar62._4_4_;
                auVar94._8_4_ = fVar18 * auVar62._8_4_;
                auVar94._12_4_ = fVar19 * auVar62._12_4_;
                auVar62 = vfmsub213ps_fma(auVar62,auVar70,auVar86);
                auVar96 = vandps_avx(auVar50,auVar67);
                auVar55 = vandps_avx(auVar86,auVar67);
                auVar96 = vcmpps_avx(auVar96,auVar55,1);
                local_808 = vblendvps_avx(auVar62,auVar20,auVar96);
                auVar87._0_4_ = fVar101 * auVar82._0_4_;
                auVar87._4_4_ = fVar104 * auVar82._4_4_;
                auVar87._8_4_ = fVar105 * auVar82._8_4_;
                auVar87._12_4_ = fVar106 * auVar82._12_4_;
                auVar62 = vfmsub213ps_fma(auVar82,auVar80,auVar94);
                auVar51._0_4_ = auVar21._0_4_ * fVar109;
                auVar51._4_4_ = auVar21._4_4_ * fVar112;
                auVar51._8_4_ = auVar21._8_4_ * fVar113;
                auVar51._12_4_ = auVar21._12_4_ * fVar114;
                auVar20 = vfmsub213ps_fma(auVar69,auVar81,auVar51);
                auVar96 = vandps_avx(auVar51,auVar67);
                auVar55 = vandps_avx(auVar94,auVar67);
                auVar96 = vcmpps_avx(auVar96,auVar55,1);
                local_7f8 = vblendvps_avx(auVar62,auVar20,auVar96);
                auVar62 = vfmsub213ps_fma(auVar21,auVar70,auVar58);
                auVar56 = vfmsub213ps_fma(auVar56,auVar81,auVar87);
                auVar96 = vandps_avx(auVar58,auVar67);
                auVar55 = vandps_avx(auVar87,auVar67);
                auVar96 = vcmpps_avx(auVar96,auVar55,1);
                local_7e8 = vblendvps_avx(auVar56,auVar62,auVar96);
                auVar65._0_4_ = local_7e8._0_4_ * local_ab8._4_4_;
                auVar65._4_4_ = local_7e8._4_4_ * local_ab8._4_4_;
                auVar65._8_4_ = local_7e8._8_4_ * local_ab8._4_4_;
                auVar65._12_4_ = local_7e8._12_4_ * local_ab8._4_4_;
                auVar96 = vfmadd213ps_fma(auVar44,local_7f8,auVar65);
                auVar96 = vfmadd213ps_fma(auVar108,local_808,auVar96);
                auVar88._0_4_ = auVar96._0_4_ + auVar96._0_4_;
                auVar88._4_4_ = auVar96._4_4_ + auVar96._4_4_;
                auVar88._8_4_ = auVar96._8_4_ + auVar96._8_4_;
                auVar88._12_4_ = auVar96._12_4_ + auVar96._12_4_;
                auVar66._0_4_ = local_7e8._0_4_ * fVar12;
                auVar66._4_4_ = local_7e8._4_4_ * fVar13;
                auVar66._8_4_ = local_7e8._8_4_ * fVar14;
                auVar66._12_4_ = local_7e8._12_4_ * fVar15;
                auVar96 = vfmadd213ps_fma(auVar54,local_7f8,auVar66);
                auVar97 = vfmadd213ps_fma(auVar97,local_808,auVar96);
                auVar96 = vrcpps_avx(auVar88);
                auVar100._8_4_ = 0x3f800000;
                auVar100._0_8_ = &DAT_3f8000003f800000;
                auVar100._12_4_ = 0x3f800000;
                auVar54 = vfnmadd213ps_fma(auVar96,auVar88,auVar100);
                auVar96 = vfmadd132ps_fma(auVar54,auVar96,auVar96);
                local_818._0_4_ = auVar96._0_4_ * (auVar97._0_4_ + auVar97._0_4_);
                local_818._4_4_ = auVar96._4_4_ * (auVar97._4_4_ + auVar97._4_4_);
                local_818._8_4_ = auVar96._8_4_ * (auVar97._8_4_ + auVar97._8_4_);
                local_818._12_4_ = auVar96._12_4_ * (auVar97._12_4_ + auVar97._12_4_);
                uVar25 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar95._4_4_ = uVar25;
                auVar95._0_4_ = uVar25;
                auVar95._8_4_ = uVar25;
                auVar95._12_4_ = uVar25;
                auVar96 = vcmpps_avx(auVar95,local_818,2);
                fVar12 = ray->tfar;
                auVar102._4_4_ = fVar12;
                auVar102._0_4_ = fVar12;
                auVar102._8_4_ = fVar12;
                auVar102._12_4_ = fVar12;
                auVar97 = vcmpps_avx(local_818,auVar102,2);
                auVar96 = vandps_avx(auVar97,auVar96);
                uVar31 = CONCAT44(auVar88._4_4_,auVar88._0_4_);
                auVar103._0_8_ = uVar31 ^ 0x8000000080000000;
                auVar103._8_4_ = -auVar88._8_4_;
                auVar103._12_4_ = -auVar88._12_4_;
                auVar97 = vcmpps_avx(auVar103,auVar88,4);
                auVar96 = vandps_avx(auVar97,auVar96);
                auVar41 = vandps_avx(auVar41,auVar24);
                auVar96 = vpslld_avx(auVar96,0x1f);
                auVar97 = vpsrad_avx(auVar96,0x1f);
                auVar96 = auVar41 & auVar97;
                if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar96[0xf] < '\0') {
                  local_848 = vandps_avx(auVar97,auVar41);
                  auVar41 = vrcpps_avx(local_868);
                  auVar59._8_4_ = 0x3f800000;
                  auVar59._0_8_ = &DAT_3f8000003f800000;
                  auVar59._12_4_ = 0x3f800000;
                  auVar96 = vfnmadd213ps_fma(local_868,auVar41,auVar59);
                  auVar41 = vfmadd132ps_fma(auVar96,auVar41,auVar41);
                  auVar52._8_4_ = 0x219392ef;
                  auVar52._0_8_ = 0x219392ef219392ef;
                  auVar52._12_4_ = 0x219392ef;
                  auVar71 = vcmpps_avx(auVar71,auVar52,5);
                  auVar71 = vandps_avx(auVar41,auVar71);
                  auVar45._0_4_ = local_888 * auVar71._0_4_;
                  auVar45._4_4_ = fStack_884 * auVar71._4_4_;
                  auVar45._8_4_ = fStack_880 * auVar71._8_4_;
                  auVar45._12_4_ = fStack_87c * auVar71._12_4_;
                  local_838 = vminps_avx(auVar45,auVar59);
                  auVar46._0_4_ = auVar71._0_4_ * local_878._0_4_;
                  auVar46._4_4_ = auVar71._4_4_ * local_878._4_4_;
                  auVar46._8_4_ = auVar71._8_4_ * local_878._8_4_;
                  auVar46._12_4_ = auVar71._12_4_ * local_878._12_4_;
                  local_828 = vminps_avx(auVar46,auVar59);
                  uVar25 = vmovmskps_avx(local_848);
                  uVar31 = CONCAT44((int)((ulong)pNVar39 >> 0x20),uVar25);
                  do {
                    uVar32 = 0;
                    for (uVar30 = uVar31; (uVar30 & 1) == 0;
                        uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                      uVar32 = uVar32 + 1;
                    }
                    h.geomID = *(uint *)((long)&local_898 + uVar32 * 4);
                    pGVar10 = (pSVar4->geometries).items[h.geomID].ptr;
                    if ((pGVar10->mask & ray->mask) == 0) {
                      uVar31 = uVar31 ^ 1L << (uVar32 & 0x3f);
                      bVar23 = true;
                    }
                    else {
                      pRVar11 = local_a98->args;
                      if ((pRVar11->filter != (RTCFilterFunctionN)0x0) ||
                         (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        uVar30 = (ulong)(uint)((int)uVar32 * 4);
                        h.u = *(float *)(local_838 + uVar30);
                        h.v = *(float *)(local_828 + uVar30);
                        args.context = local_a98->user;
                        h.primID = *(uint *)((long)&local_8a8 + uVar30);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_808 + uVar30);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_7f8 + uVar30);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_7e8 + uVar30);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar12 = ray->tfar;
                        ray->tfar = *(float *)(local_818 + uVar30);
                        local_acc = -1;
                        args.valid = &local_acc;
                        args.geometryUserPtr = pGVar10->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          local_ab8 = ray;
                          local_ac8._0_8_ = uVar34;
                          (*pGVar10->occlusionFilterN)(&args);
                          ray = local_ab8;
                          uVar34 = local_ac8._0_8_;
                          if (*args.valid != 0) goto LAB_0051e078;
LAB_0051e0c9:
                          ray->tfar = fVar12;
                          uVar31 = uVar31 ^ 1L << (uVar32 & 0x3f);
                          bVar23 = true;
                          goto LAB_0051df29;
                        }
LAB_0051e078:
                        if (pRVar11->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar11->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar11->filter)(&args);
                          }
                          if (*args.valid == 0) goto LAB_0051e0c9;
                        }
                      }
                      bVar23 = false;
                    }
LAB_0051df29:
                    iVar35 = 0;
                    if (!bVar23) {
                      uVar31 = local_a70;
                      uVar32 = local_a88;
                      uVar30 = local_a78;
                      uVar33 = local_a80;
                      uVar38 = local_a90;
                      if (bVar40) {
                        ray->tfar = -INFINITY;
                        iVar35 = 3;
                      }
                      goto LAB_0051e162;
                    }
                  } while (uVar31 != 0);
                  pNVar39 = (NodeRef *)0x0;
                }
              }
              iVar35 = 0;
              local_a60 = local_a60 + 1;
              bVar40 = local_a60 < local_a68;
              uVar31 = local_a70;
              uVar32 = local_a88;
              uVar30 = local_a78;
              uVar33 = local_a80;
              uVar38 = local_a90;
            } while (local_a60 != local_a68);
          }
        }
LAB_0051e162:
      } while (iVar35 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }